

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

uint64_t kfold_int64arith(uint64_t k1,uint64_t k2,IROp op)

{
  switch(op) {
  case IR_BAND:
    return k1 & k2;
  case IR_BOR:
    return k1 | k2;
  case IR_BXOR:
    k1 = k1 ^ k2;
    break;
  case IR_ADD:
    return k1 + k2;
  case IR_SUB:
    return k1 - k2;
  case IR_MUL:
    return k1 * k2;
  }
  return k1;
}

Assistant:

static uint64_t kfold_int64arith(uint64_t k1, uint64_t k2, IROp op)
{
  switch (op) {
#if LJ_64 || LJ_HASFFI
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
#endif
#if LJ_HASFFI
  case IR_MUL: k1 *= k2; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
#endif
  default: UNUSED(k2); lua_assert(0); break;
  }
  return k1;
}